

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::DebugNodeTableSettings(ImGuiTableSettings *settings)

{
  bool bVar1;
  byte bVar2;
  ImGuiTableColumnSettings *pIVar3;
  ImGuiTableSettings *in_RDI;
  ImGuiSortDirection sort_dir;
  ImGuiTableColumnSettings *column_settings;
  int n;
  char *local_58;
  char *local_40;
  char *local_38;
  uint local_c;
  
  bVar1 = TreeNode((void *)(ulong)in_RDI->ID,"Settings 0x%08X (%d columns)",(ulong)in_RDI->ID,
                   (ulong)(uint)(int)in_RDI->ColumnsCount);
  if (bVar1) {
    BulletText("SaveFlags: 0x%08X",(ulong)(uint)in_RDI->SaveFlags);
    BulletText("ColumnsCount: %d (max %d)",(ulong)(uint)(int)in_RDI->ColumnsCount,
               (ulong)(uint)(int)in_RDI->ColumnsCountMax);
    for (local_c = 0; (int)local_c < (int)in_RDI->ColumnsCount; local_c = local_c + 1) {
      pIVar3 = ImGuiTableSettings::GetColumnSettings(in_RDI);
      pIVar3 = pIVar3 + (int)local_c;
      if (pIVar3->SortOrder == -1) {
        bVar2 = 0;
      }
      else {
        bVar2 = pIVar3->field_0xb & 3;
      }
      if (bVar2 == 1) {
        local_38 = "Asc";
      }
      else {
        if (bVar2 == 2) {
          local_40 = "Des";
        }
        else {
          local_40 = "---";
        }
        local_38 = local_40;
      }
      if (((byte)pIVar3->field_0xb >> 3 & 1) == 0) {
        local_58 = "Width ";
      }
      else {
        local_58 = "Weight";
      }
      BulletText((char *)(double)pIVar3->WidthOrWeight,
                 "Column %d Order %d SortOrder %d %s Vis %d %s %7.3f UserID 0x%08X",(ulong)local_c,
                 (ulong)(uint)(int)pIVar3->DisplayOrder,(ulong)(uint)(int)pIVar3->SortOrder,local_38
                 ,(ulong)((byte)pIVar3->field_0xb >> 2 & 1),local_58,pIVar3->UserID);
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeTableSettings(ImGuiTableSettings* settings)
{
    if (!TreeNode((void*)(intptr_t)settings->ID, "Settings 0x%08X (%d columns)", settings->ID, settings->ColumnsCount))
        return;
    BulletText("SaveFlags: 0x%08X", settings->SaveFlags);
    BulletText("ColumnsCount: %d (max %d)", settings->ColumnsCount, settings->ColumnsCountMax);
    for (int n = 0; n < settings->ColumnsCount; n++)
    {
        ImGuiTableColumnSettings* column_settings = &settings->GetColumnSettings()[n];
        ImGuiSortDirection sort_dir = (column_settings->SortOrder != -1) ? (ImGuiSortDirection)column_settings->SortDirection : ImGuiSortDirection_None;
        BulletText("Column %d Order %d SortOrder %d %s Vis %d %s %7.3f UserID 0x%08X",
            n, column_settings->DisplayOrder, column_settings->SortOrder,
            (sort_dir == ImGuiSortDirection_Ascending) ? "Asc" : (sort_dir == ImGuiSortDirection_Descending) ? "Des" : "---",
            column_settings->IsEnabled, column_settings->IsStretch ? "Weight" : "Width ", column_settings->WidthOrWeight, column_settings->UserID);
    }
    TreePop();
}